

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

ArguDesc * cxxopts::values::parser_tool::ParseArgument(char *arg,bool *matched)

{
  bool bVar1;
  difference_type dVar2;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *this;
  const_reference __sub;
  byte *in_RDX;
  ArguDesc *in_RDI;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  ArguDesc *argu_desc;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  *in_stack_ffffffffffffff10;
  string *psVar3;
  size_type in_stack_ffffffffffffff18;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff20;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  ArguDesc *this_00;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [35];
  undefined1 local_45;
  byte *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results(in_stack_ffffffffffffff10);
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (match_flag_type)(in_stack_ffffffffffffff18 >> 0x20));
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)0x121f18);
  *local_18 = !bVar1;
  local_45 = 0;
  ArguDesc::ArguDesc(in_RDI);
  if ((*local_18 & 1) != 0) {
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::operator[]
              ((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::sub_match<const_char_*>::str((sub_match<const_char_*> *)this_00);
    psVar3 = local_68;
    std::__cxx11::string::operator=((string *)in_RDI,psVar3);
    std::__cxx11::string::~string(psVar3);
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::operator[]
              ((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    dVar2 = std::__cxx11::sub_match<const_char_*>::length
                      ((sub_match<const_char_*> *)in_stack_ffffffffffffff20);
    in_RDI->set_value = 0 < dVar2;
    this = (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *)
           std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::sub_match<const_char_*>::str((sub_match<const_char_*> *)this_00);
    psVar3 = local_88;
    std::__cxx11::string::operator=((string *)&in_RDI->value,psVar3);
    std::__cxx11::string::~string(psVar3);
    __sub = std::__cxx11::
            match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
            operator[](this,in_stack_ffffffffffffff18);
    dVar2 = std::__cxx11::sub_match<const_char_*>::length((sub_match<const_char_*> *)this);
    if (0 < dVar2) {
      in_RDI->grouping = true;
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
      operator[](this,(size_type)__sub);
      std::__cxx11::sub_match<const_char_*>::str((sub_match<const_char_*> *)this_00);
      std::__cxx11::string::operator=((string *)in_RDI,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
  }
  local_45 = 1;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)0x1220f2);
  return this_00;
}

Assistant:

inline ArguDesc ParseArgument(const char *arg, bool &matched)
{
  std::match_results<const char*> result;
  std::regex_match(arg, result, option_matcher);
  matched = !result.empty();

  ArguDesc argu_desc;
  if (matched) {
    argu_desc.arg_name = result[1].str();
    argu_desc.set_value = result[2].length() > 0;
    argu_desc.value = result[3].str();
    if (result[4].length() > 0)
    {
      argu_desc.grouping = true;
      argu_desc.arg_name = result[4].str();
    }
  }

  return argu_desc;
}